

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void __thiscall
testing::internal::
ElementsAreMatcherImpl<std::vector<unsigned_long,std::allocator<unsigned_long>>const&>::
ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<unsigned_long_const&>*,std::vector<testing::Matcher<unsigned_long_const&>,std::allocator<testing::Matcher<unsigned_long_const&>>>>>
          (ElementsAreMatcherImpl<std::vector<unsigned_long,std::allocator<unsigned_long>>const&>
           *this,__normal_iterator<testing::Matcher<const_unsigned_long_&>_*,_std::vector<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>_>
                 first,
          __normal_iterator<testing::Matcher<const_unsigned_long_&>_*,_std::vector<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>_>
          last)

{
  MatcherBase<const_unsigned_long_&> MStack_38;
  
  *(undefined ***)this = &PTR__ElementsAreMatcherImpl_001ab358;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  for (; first._M_current != last._M_current; first._M_current = first._M_current + 1) {
    Matcher<const_unsigned_long_&>::Matcher
              ((Matcher<const_unsigned_long_&> *)&MStack_38,first._M_current);
    std::
    vector<testing::Matcher<unsigned_long_const&>,std::allocator<testing::Matcher<unsigned_long_const&>>>
    ::emplace_back<testing::Matcher<unsigned_long_const&>>
              ((vector<testing::Matcher<unsigned_long_const&>,std::allocator<testing::Matcher<unsigned_long_const&>>>
                *)(this + 8),(Matcher<const_unsigned_long_&> *)&MStack_38);
    MatcherBase<const_unsigned_long_&>::~MatcherBase(&MStack_38);
  }
  return;
}

Assistant:

ElementsAreMatcherImpl(InputIter first, InputIter last) {
    while (first != last) {
      matchers_.push_back(MatcherCast<const Element&>(*first++));
    }
  }